

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_typed_array_subarray(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  undefined4 in_register_0000000c;
  JSValueUnion JVar5;
  JSValueUnion JVar6;
  int64_t iVar7;
  JSValue *argv_00;
  ulong uVar8;
  JSRefCountHeader *p;
  JSValue this_val_00;
  JSValue this_val_01;
  JSValue v;
  JSValue JVar9;
  int final;
  int start;
  int local_9c;
  JSValueUnion local_98;
  int local_8c;
  JSValueUnion local_88;
  ulong local_80;
  JSValueUnion local_78;
  ulong local_70;
  JSValueUnion local_68;
  int64_t local_60;
  ulong local_58;
  undefined8 local_50;
  ulong local_48;
  undefined8 local_40;
  
  JVar6 = this_val.u;
  local_78 = JVar6;
  if (((this_val.tag & 0xffffffffU) != 0xffffffff) ||
     (JVar5 = JVar6, 8 < (ushort)(*(short *)((long)JVar6.ptr + 6) - 0x15U))) {
    JVar5.float64 = 0.0;
    JS_ThrowTypeError(ctx,"not a %s","TypedArray",CONCAT44(in_register_0000000c,argc));
  }
  if (JVar5.ptr != (void *)0x0) {
    iVar4 = *(int *)((long)JVar5.ptr + 0x40);
    argv_00 = (JSValue *)0x0;
    local_98 = JVar6;
    local_80 = this_val.tag;
    iVar3 = JS_ToInt32Clamp(ctx,&local_8c,*argv,0,iVar4,iVar4);
    if (iVar3 == 0) {
      local_9c = iVar4;
      if ((int)argv[1].tag != 3) {
        argv_00 = (JSValue *)0x0;
        JVar9.tag = argv[1].tag;
        JVar9.u.ptr = argv[1].u.ptr;
        iVar4 = JS_ToInt32Clamp(ctx,&local_9c,JVar9,0,iVar4,iVar4);
        if (iVar4 != 0) goto LAB_0016fa5e;
      }
      uVar2 = local_80;
      uVar8 = (ulong)(uint)(local_9c - local_8c);
      if (local_9c - local_8c < 1) {
        uVar8 = 0;
      }
      this_val_00.tag = local_80;
      this_val_00.u.ptr = local_98.ptr;
      JVar9 = js_typed_array_get_byteOffset(ctx,this_val_00,0);
      local_78 = JVar9.u;
      if ((uint)JVar9.tag != 6) {
        bVar1 = "includes"[(ulong)*(ushort *)((long)JVar5.ptr + 6) + 1];
        if ((0xfffffff4 < (uint)JVar9.tag) &&
           (iVar4 = *local_78.ptr, *(int *)local_78.ptr = iVar4 + -1, iVar4 < 2)) {
          __JS_FreeValueRT(ctx->rt,JVar9);
        }
        local_78.float64 = local_98.float64;
        if (((int)this_val.tag != -1) ||
           (JVar6 = local_98, 8 < (ushort)(*(short *)((long)local_98.ptr + 6) - 0x15U))) {
          JVar6.float64 = 0.0;
          JS_ThrowTypeError(ctx,"not a %s","TypedArray");
        }
        if (JVar6.ptr == (void *)0x0) {
          JVar5.float64 = 0.0;
          iVar7 = 6;
        }
        else {
          JVar5 = (JSValueUnion)((JSValueUnion *)(*(long *)((long)JVar6.ptr + 0x30) + 0x18))->ptr;
          *(int *)JVar5.ptr = *JVar5.ptr + 1;
          iVar7 = -1;
        }
        if ((int)iVar7 != 6) {
          local_58 = (ulong)(uint)((local_8c << (bVar1 & 0x1f)) + JVar9.u._0_4_);
          local_78.float64 = local_98.float64;
          local_70 = uVar2;
          local_50 = 0;
          local_40 = 0;
          this_val_01.tag = (int64_t)&local_78;
          this_val_01.u.float64 = 1.97626258336499e-323;
          local_68 = JVar5;
          local_60 = iVar7;
          local_48 = uVar8;
          JVar9 = js_typed_array___speciesCreate(ctx,this_val_01,(int)uVar8,argv_00);
          if (JVar6.ptr == (void *)0x0) {
            return JVar9;
          }
          iVar4 = *JVar5.ptr;
          *(int *)JVar5.ptr = iVar4 + -1;
          if (iVar4 < 2) {
            v.tag = iVar7;
            v.u.ptr = JVar5.ptr;
            local_88 = JVar5;
            __JS_FreeValueRT(ctx->rt,v);
            return JVar9;
          }
          return JVar9;
        }
      }
    }
  }
LAB_0016fa5e:
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_typed_array_subarray(JSContext *ctx, JSValueConst this_val,
                                       int argc, JSValueConst *argv)
{
    JSValueConst args[4];
    JSValue arr, byteOffset, ta_buffer;
    JSObject *p;
    int len, start, final, count, shift, offset;

    p = get_typed_array(ctx, this_val, 0);
    if (!p)
        goto exception;
    len = p->u.array.count;
    if (JS_ToInt32Clamp(ctx, &start, argv[0], 0, len, len))
        goto exception;

    final = len;
    if (!JS_IsUndefined(argv[1])) {
        if (JS_ToInt32Clamp(ctx, &final, argv[1], 0, len, len))
            goto exception;
    }
    count = max_int(final - start, 0);
    byteOffset = js_typed_array_get_byteOffset(ctx, this_val, 0);
    if (JS_IsException(byteOffset))
        goto exception;
    shift = typed_array_size_log2(p->class_id);
    offset = JS_VALUE_GET_INT(byteOffset) + (start << shift);
    JS_FreeValue(ctx, byteOffset);
    ta_buffer = js_typed_array_get_buffer(ctx, this_val, 0);
    if (JS_IsException(ta_buffer))
        goto exception;
    args[0] = this_val;
    args[1] = ta_buffer;
    args[2] = JS_NewInt32(ctx, offset);
    args[3] = JS_NewInt32(ctx, count);
    arr = js_typed_array___speciesCreate(ctx, JS_UNDEFINED, 4, args);
    JS_FreeValue(ctx, ta_buffer);
    return arr;

 exception:
    return JS_EXCEPTION;
}